

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void helper_fdivr_STN_ST0_x86_64(CPUX86State *env,int st_index)

{
  undefined2 uVar1;
  uint uVar2;
  uint64_t uVar3;
  unkuint10 Var4;
  unkuint10 *pVar5;
  uint uVar6;
  floatx80 fVar7;
  floatx80 b;
  
  uVar2 = env->fpstt;
  uVar6 = (st_index + uVar2 & 7) << 4;
  pVar5 = (unkuint10 *)((long)env->fpregs + (ulong)uVar6);
  uVar3 = env->fpregs[uVar2].d.low;
  uVar1 = *(undefined2 *)((long)env->fpregs + (ulong)uVar2 * 0x10 + 8);
  Var4 = *pVar5;
  if ((long)*pVar5 == 0 && (*(ushort *)((long)env->fpregs + (ulong)uVar6 + 8) & 0x7fff) == 0) {
    uVar2._0_2_ = env->fpus;
    uVar2._2_2_ = env->fpuc;
    env->fpus = (uint16_t)(uVar2 | 4);
    if ((~(uint)env->fpuc & (uVar2 | 4) & 0x3f) != 0) {
      env->fpus = (undefined2)uVar2 | 0x8084;
    }
  }
  fVar7.high = uVar1;
  fVar7.low = uVar3;
  fVar7._10_6_ = 0;
  b._10_6_ = 0;
  b._0_10_ = Var4;
  fVar7 = floatx80_div_x86_64(fVar7,b,&env->fp_status);
  *(uint64_t *)pVar5 = fVar7.low;
  *(uint16_t *)((long)env->fpregs + (ulong)uVar6 + 8) = fVar7.high;
  return;
}

Assistant:

void helper_fdivr_STN_ST0(CPUX86State *env, int st_index)
{
    floatx80 *p;

    p = &ST(st_index);
    *p = helper_fdiv(env, ST0, *p);
}